

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timerfd-test.c
# Opt level: O2

atf_error_t microatf_tp_add_tcs(atf_tp_t *tp)

{
  char cVar1;
  atf_error_t paVar2;
  
  paVar2 = (atf_error_t)microatf_tp_add_tc(tp,&microatf_tc_timerfd__many_timers);
  cVar1 = atf_is_error(paVar2);
  if (cVar1 == '\0') {
    paVar2 = (atf_error_t)microatf_tp_add_tc(tp,&microatf_tc_timerfd__simple_timer);
    cVar1 = atf_is_error(paVar2);
    if (cVar1 == '\0') {
      paVar2 = (atf_error_t)microatf_tp_add_tc(tp,&microatf_tc_timerfd__simple_periodic_timer);
      cVar1 = atf_is_error(paVar2);
      if (cVar1 == '\0') {
        paVar2 = (atf_error_t)microatf_tp_add_tc(tp,&microatf_tc_timerfd__complex_periodic_timer);
        cVar1 = atf_is_error(paVar2);
        if (cVar1 == '\0') {
          paVar2 = (atf_error_t)microatf_tp_add_tc(tp,&microatf_tc_timerfd__reset_periodic_timer);
          cVar1 = atf_is_error(paVar2);
          if (cVar1 == '\0') {
            paVar2 = (atf_error_t)
                     microatf_tp_add_tc(tp,&microatf_tc_timerfd__reenable_periodic_timer);
            cVar1 = atf_is_error(paVar2);
            if (cVar1 == '\0') {
              paVar2 = (atf_error_t)microatf_tp_add_tc(tp,&microatf_tc_timerfd__expire_five);
              cVar1 = atf_is_error(paVar2);
              if (cVar1 == '\0') {
                paVar2 = (atf_error_t)microatf_tp_add_tc(tp,&microatf_tc_timerfd__simple_gettime);
                cVar1 = atf_is_error(paVar2);
                if (cVar1 == '\0') {
                  paVar2 = (atf_error_t)
                           microatf_tp_add_tc(tp,&
                                                 microatf_tc_timerfd__simple_blocking_periodic_timer
                                             );
                  cVar1 = atf_is_error(paVar2);
                  if (cVar1 == '\0') {
                    paVar2 = (atf_error_t)
                             microatf_tp_add_tc(tp,&microatf_tc_timerfd__argument_checks);
                    cVar1 = atf_is_error(paVar2);
                    if (cVar1 == '\0') {
                      paVar2 = (atf_error_t)
                               microatf_tp_add_tc(tp,&microatf_tc_timerfd__upgrade_simple_to_complex
                                                 );
                      cVar1 = atf_is_error(paVar2);
                      if (cVar1 == '\0') {
                        paVar2 = (atf_error_t)
                                 microatf_tp_add_tc(tp,&microatf_tc_timerfd__absolute_timer);
                        cVar1 = atf_is_error(paVar2);
                        if (cVar1 == '\0') {
                          paVar2 = (atf_error_t)
                                   microatf_tp_add_tc(tp,&
                                                  microatf_tc_timerfd__absolute_timer_in_the_past);
                          cVar1 = atf_is_error(paVar2);
                          if (cVar1 == '\0') {
                            paVar2 = (atf_error_t)
                                     microatf_tp_add_tc(tp,&microatf_tc_timerfd__reset_absolute);
                            cVar1 = atf_is_error(paVar2);
                            if (cVar1 == '\0') {
                              paVar2 = (atf_error_t)
                                       microatf_tp_add_tc(tp,&
                                                  microatf_tc_timerfd__periodic_timer_performance);
                              cVar1 = atf_is_error(paVar2);
                              if (cVar1 == '\0') {
                                paVar2 = (atf_error_t)
                                         microatf_tp_add_tc(tp,&
                                                  microatf_tc_timerfd__argument_overflow);
                                cVar1 = atf_is_error(paVar2);
                                if (cVar1 == '\0') {
                                  paVar2 = (atf_error_t)
                                           microatf_tp_add_tc(tp,&
                                                  microatf_tc_timerfd__short_evfilt_timer_timeout);
                                  cVar1 = atf_is_error(paVar2);
                                  if (cVar1 == '\0') {
                                    paVar2 = (atf_error_t)
                                             microatf_tp_add_tc(tp,&
                                                  microatf_tc_timerfd__unmodified_errno);
                                    cVar1 = atf_is_error(paVar2);
                                    if (cVar1 == '\0') {
                                      paVar2 = (atf_error_t)
                                               microatf_tp_add_tc(tp,&
                                                  microatf_tc_timerfd__reset_to_very_long);
                                      cVar1 = atf_is_error(paVar2);
                                      if (cVar1 == '\0') {
                                        paVar2 = (atf_error_t)atf_no_error();
                                        return paVar2;
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return paVar2;
}

Assistant:

ATF_TP_ADD_TCS(tp)
{
	ATF_TP_ADD_TC(tp, timerfd__many_timers);
	ATF_TP_ADD_TC(tp, timerfd__simple_timer);
	ATF_TP_ADD_TC(tp, timerfd__simple_periodic_timer);
	ATF_TP_ADD_TC(tp, timerfd__complex_periodic_timer);
	ATF_TP_ADD_TC(tp, timerfd__reset_periodic_timer);
	ATF_TP_ADD_TC(tp, timerfd__reenable_periodic_timer);
	ATF_TP_ADD_TC(tp, timerfd__expire_five);
	ATF_TP_ADD_TC(tp, timerfd__simple_gettime);
	ATF_TP_ADD_TC(tp, timerfd__simple_blocking_periodic_timer);
	ATF_TP_ADD_TC(tp, timerfd__argument_checks);
	ATF_TP_ADD_TC(tp, timerfd__upgrade_simple_to_complex);
	ATF_TP_ADD_TC(tp, timerfd__absolute_timer);
	ATF_TP_ADD_TC(tp, timerfd__absolute_timer_in_the_past);
	ATF_TP_ADD_TC(tp, timerfd__reset_absolute);
	ATF_TP_ADD_TC(tp, timerfd__periodic_timer_performance);
	ATF_TP_ADD_TC(tp, timerfd__argument_overflow);
	ATF_TP_ADD_TC(tp, timerfd__short_evfilt_timer_timeout);
	ATF_TP_ADD_TC(tp, timerfd__unmodified_errno);
	ATF_TP_ADD_TC(tp, timerfd__reset_to_very_long);

	return atf_no_error();
}